

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signal.h
# Opt level: O0

void __thiscall
sc_core::sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0>::update
          (sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *this)

{
  bool bVar1;
  sc_signal_t<sc_dt::sc_logic,_(sc_core::sc_writer_policy)0> *in_RDI;
  
  sc_writer_policy_check_write::update((sc_writer_policy_check_write *)in_RDI);
  bVar1 = sc_dt::operator==(&in_RDI->m_new_val,&in_RDI->m_cur_val);
  if (!bVar1) {
    do_update(in_RDI);
  }
  return;
}

Assistant:

void
sc_signal_t<T,POL>::update()
{
    policy_type::update();
    if( !( m_new_val == m_cur_val ) ) {
        do_update();
    }
}